

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

uint32_t get_dist_len_price(lzma_lzma1_encoder *coder,uint32_t dist,uint32_t len,uint32_t pos_state)

{
  uint32_t uVar1;
  uint local_2c;
  uint32_t local_24;
  uint32_t dist_slot;
  uint32_t price;
  uint32_t dist_state;
  uint32_t pos_state_local;
  uint32_t len_local;
  uint32_t dist_local;
  lzma_lzma1_encoder *coder_local;
  
  if (len < 6) {
    local_2c = len - 2;
  }
  else {
    local_2c = 3;
  }
  if (dist < 0x80) {
    local_24 = coder->dist_prices[local_2c][dist];
  }
  else {
    uVar1 = get_dist_slot_2(dist);
    local_24 = coder->dist_slot_prices[local_2c][uVar1] + coder->align_prices[dist & 0xf];
  }
  uVar1 = get_len_price(&coder->match_len_encoder,len,pos_state);
  return uVar1 + local_24;
}

Assistant:

static inline uint32_t
get_dist_len_price(const lzma_lzma1_encoder *const coder, const uint32_t dist,
		const uint32_t len, const uint32_t pos_state)
{
	const uint32_t dist_state = get_dist_state(len);
	uint32_t price;

	if (dist < FULL_DISTANCES) {
		price = coder->dist_prices[dist_state][dist];
	} else {
		const uint32_t dist_slot = get_dist_slot_2(dist);
		price = coder->dist_slot_prices[dist_state][dist_slot]
				+ coder->align_prices[dist & ALIGN_MASK];
	}

	price += get_len_price(&coder->match_len_encoder, len, pos_state);

	return price;
}